

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void blend_a64_d16_mask_w32_avx2
               (uint8_t *dst,CONV_BUF_TYPE *src0,CONV_BUF_TYPE *src1,__m256i *m0,__m256i *m1,
               __m256i *v_round_offset,__m256i *v_maxval,int shift)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*in_RCX) [32];
  __m256i *in_RDX;
  __m256i *in_RSI;
  __m256i *a;
  undefined8 *in_RDI;
  undefined1 (*in_R8) [32];
  undefined1 (*in_R9) [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 (*in_stack_00000008) [32];
  __m256i res1;
  __m256i res0;
  __m256i res1_hi;
  __m256i res1_lo;
  __m256i res0_hi;
  __m256i res0_lo;
  __m256i s1_1;
  __m256i s1_0;
  __m256i s0_1;
  __m256i s0_0;
  __m256i max_minus_m1;
  __m256i max_minus_m0;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  
  auVar1 = vpsubw_avx2(*in_stack_00000008,*in_RCX);
  auVar2 = vpsubw_avx2(*in_stack_00000008,*in_R8);
  a = in_RSI;
  auVar5 = auVar2;
  yy_loadu_256(in_RSI,in_RSI);
  auVar6 = auVar5;
  yy_loadu_256(in_RSI + 1,a);
  auVar7 = auVar6;
  yy_loadu_256(in_RDX,a);
  auVar8 = auVar7;
  yy_loadu_256(in_RDX + 1,a);
  auVar3 = vpunpcklwd_avx2(auVar5,auVar7);
  auVar4 = vpunpcklwd_avx2(*in_RCX,auVar1);
  auVar3 = vpmaddwd_avx2(auVar3,auVar4);
  auVar4 = vpunpckhwd_avx2(auVar5,auVar7);
  auVar1 = vpunpckhwd_avx2(*in_RCX,auVar1);
  auVar1 = vpmaddwd_avx2(auVar4,auVar1);
  auVar4 = vpunpcklwd_avx2(auVar6,auVar8);
  auVar7 = vpunpcklwd_avx2(*in_R8,auVar2);
  auVar4 = vpmaddwd_avx2(auVar4,auVar7);
  auVar7 = vpunpckhwd_avx2(auVar6,auVar8);
  auVar2 = vpunpckhwd_avx2(*in_R8,auVar2);
  auVar2 = vpmaddwd_avx2(auVar7,auVar2);
  auVar3 = vpsubd_avx2(auVar3,*in_R9);
  auVar3 = vpsrad_avx2(auVar3,ZEXT416((uint)v_maxval));
  auVar1 = vpsubd_avx2(auVar1,*in_R9);
  auVar1 = vpsrad_avx2(auVar1,ZEXT416((uint)v_maxval));
  auVar4 = vpsubd_avx2(auVar4,*in_R9);
  auVar4 = vpsrad_avx2(auVar4,ZEXT416((uint)v_maxval));
  auVar2 = vpsubd_avx2(auVar2,*in_R9);
  auVar2 = vpsrad_avx2(auVar2,ZEXT416((uint)v_maxval));
  auVar3 = vpackssdw_avx2(auVar3,auVar1);
  auVar1 = vpackssdw_avx2(auVar4,auVar2);
  auVar3 = vpackuswb_avx2(auVar3,auVar1);
  auVar3 = vpermq_avx2(auVar3,0xd8);
  local_880 = auVar3._0_8_;
  uStack_878 = auVar3._8_8_;
  uStack_870 = auVar3._16_8_;
  uStack_868 = auVar3._24_8_;
  *in_RDI = local_880;
  in_RDI[1] = uStack_878;
  in_RDI[2] = uStack_870;
  in_RDI[3] = uStack_868;
  return;
}

Assistant:

static inline void blend_a64_d16_mask_w32_avx2(
    uint8_t *dst, const CONV_BUF_TYPE *src0, const CONV_BUF_TYPE *src1,
    const __m256i *m0, const __m256i *m1, const __m256i *v_round_offset,
    const __m256i *v_maxval, int shift) {
  const __m256i max_minus_m0 = _mm256_sub_epi16(*v_maxval, *m0);
  const __m256i max_minus_m1 = _mm256_sub_epi16(*v_maxval, *m1);
  const __m256i s0_0 = yy_loadu_256(src0);
  const __m256i s0_1 = yy_loadu_256(src0 + 16);
  const __m256i s1_0 = yy_loadu_256(src1);
  const __m256i s1_1 = yy_loadu_256(src1 + 16);
  __m256i res0_lo = _mm256_madd_epi16(_mm256_unpacklo_epi16(s0_0, s1_0),
                                      _mm256_unpacklo_epi16(*m0, max_minus_m0));
  __m256i res0_hi = _mm256_madd_epi16(_mm256_unpackhi_epi16(s0_0, s1_0),
                                      _mm256_unpackhi_epi16(*m0, max_minus_m0));
  __m256i res1_lo = _mm256_madd_epi16(_mm256_unpacklo_epi16(s0_1, s1_1),
                                      _mm256_unpacklo_epi16(*m1, max_minus_m1));
  __m256i res1_hi = _mm256_madd_epi16(_mm256_unpackhi_epi16(s0_1, s1_1),
                                      _mm256_unpackhi_epi16(*m1, max_minus_m1));
  res0_lo =
      _mm256_srai_epi32(_mm256_sub_epi32(res0_lo, *v_round_offset), shift);
  res0_hi =
      _mm256_srai_epi32(_mm256_sub_epi32(res0_hi, *v_round_offset), shift);
  res1_lo =
      _mm256_srai_epi32(_mm256_sub_epi32(res1_lo, *v_round_offset), shift);
  res1_hi =
      _mm256_srai_epi32(_mm256_sub_epi32(res1_hi, *v_round_offset), shift);
  const __m256i res0 = _mm256_packs_epi32(res0_lo, res0_hi);
  const __m256i res1 = _mm256_packs_epi32(res1_lo, res1_hi);
  __m256i res = _mm256_packus_epi16(res0, res1);
  res = _mm256_permute4x64_epi64(res, 0xd8);
  _mm256_storeu_si256((__m256i *)(dst), res);
}